

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Functional::IsnanCase::compare(IsnanCase *this,void **inputs,void **outputs)

{
  Precision PVar1;
  uint uVar2;
  pointer pSVar3;
  undefined4 in_EAX;
  uint uVar4;
  ostream *poVar5;
  ostringstream *poVar6;
  bool bVar7;
  ulong uVar8;
  undefined8 uStack_28;
  
  pSVar3 = (this->super_CommonFunctionCase).m_spec.inputs.
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  PVar1 = (pSVar3->varType).m_data.basic.precision;
  uStack_28._0_4_ = in_EAX;
  uVar4 = glu::getDataTypeScalarSize((pSVar3->varType).m_data.basic.type);
  if (PVar1 == PRECISION_HIGHP) {
    if (0 < (int)uVar4) {
      uVar8 = 0;
      do {
        uVar2 = *(uint *)((long)*inputs + uVar8 * 4);
        bVar7 = (uVar2 & 0x7fffff) != 0 && (~uVar2 & 0x7f800000) == 0;
        if (*(uint *)((long)*outputs + uVar8 * 4) != (uint)bVar7) {
          poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
          std::__ostream_insert<char,std::char_traits<char>>
                    (&poVar6->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
          poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = ",4);
          uStack_28 = (ulong)CONCAT14(bVar7,(undefined4)uStack_28);
          Functional::operator<<(poVar5,(HexBool *)((long)&uStack_28 + 4));
          return false;
        }
        uVar8 = uVar8 + 1;
      } while (uVar4 != uVar8);
    }
  }
  else if (0 < (int)uVar4) {
    uVar8 = 0;
    do {
      if (1 < *(uint *)((long)*outputs + uVar8 * 4)) {
        poVar6 = &(this->super_CommonFunctionCase).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>
                  (&poVar6->super_basic_ostream<char,_std::char_traits<char>_>,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(poVar6,(int)uVar8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] = 0 / 1",9);
        return false;
      }
      uVar8 = uVar8 + 1;
    } while (uVar4 != uVar8);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		if (precision == glu::PRECISION_HIGHP)
		{
			// Only highp is required to support inf/nan
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const float		in0		= ((const float*)inputs[0])[compNdx];
				const deUint32	out0	= ((const deUint32*)outputs[0])[compNdx];
				const deUint32	ref		= tcu::Float32(in0).isNaN() ? 1u : 0u;

				if (out0 != ref)
				{
					m_failMsg << "Expected [" << compNdx << "] = " << HexBool(ref);
					return false;
				}
			}
		}
		else
		{
			// Value can be either 0 or 1
			for (int compNdx = 0; compNdx < scalarSize; compNdx++)
			{
				const int out0 = ((const int*)outputs[0])[compNdx];

				if (out0 != 0 && out0 != 1)
				{
					m_failMsg << "Expected [" << compNdx << "] = 0 / 1";
					return false;
				}
			}
		}

		return true;
	}